

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::reserve
          (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this,size_t n)

{
  uchar *puVar1;
  iterator puVar2;
  ulong in_RSI;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *in_RDI;
  int i;
  uchar *ra;
  uchar *in_stack_ffffffffffffffc8;
  polymorphic_allocator<unsigned_char> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    puVar1 = pmr::polymorphic_allocator<unsigned_char>::allocate_object<unsigned_char>
                       (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = (polymorphic_allocator<unsigned_char> *)(puVar1 + local_1c);
      puVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<unsigned_char>::construct<unsigned_char,unsigned_char>
                (&in_RDI->alloc,(uchar *)in_stack_ffffffffffffffd0,puVar2 + local_1c);
      puVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<unsigned_char>::destroy<unsigned_char>
                (&in_RDI->alloc,puVar2 + local_1c);
    }
    pmr::polymorphic_allocator<unsigned_char>::deallocate_object<unsigned_char>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x4ab3f8);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = puVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }